

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeAddSubERegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint uVar4;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint shift;
  uint extend;
  uint Rm;
  uint Rn;
  uint Rd;
  
  uVar1 = fieldFromInstruction(in_ESI,10,6);
  uVar2 = uVar1 & 7;
  if (4 < uVar2) {
    return MCDisassembler_Fail;
  }
  RegNo = fieldFromInstruction(in_ESI,0,5);
  fieldFromInstruction(in_ESI,5,5);
  uVar3 = fieldFromInstruction(in_ESI,0x10,5);
  uVar4 = MCInst_getOpcode(in_RDI);
  if (uVar4 == 0x33) {
LAB_002e5c60:
    DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
    DecodeGPR32spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
    DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
  }
  else {
    if (uVar4 == 0x37) {
LAB_002e5cfa:
      DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      goto LAB_002e5dd9;
    }
    if (uVar4 == 0x38) {
LAB_002e5d91:
      DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      goto LAB_002e5dd9;
    }
    if (uVar4 == 0x41) {
LAB_002e5c13:
      DecodeGPR32spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR32spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      goto LAB_002e5dd9;
    }
    if (uVar4 == 0x45) {
LAB_002e5cad:
      DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
      goto LAB_002e5dd9;
    }
    if (uVar4 != 0x46) {
      if (uVar4 == 0x7a0) goto LAB_002e5c60;
      if (uVar4 == 0x7a4) goto LAB_002e5cfa;
      if (uVar4 == 0x7a5) goto LAB_002e5d91;
      if (uVar4 == 0x7a9) goto LAB_002e5c13;
      if (uVar4 == 0x7ad) goto LAB_002e5cad;
      if (uVar4 != 0x7ae) {
        return MCDisassembler_Fail;
      }
    }
    DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
    DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
    DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar3,uVar1),(void *)CONCAT44(uVar2,uVar4));
  }
LAB_002e5dd9:
  MCOperand_CreateImm0(in_RDI,(ulong)uVar1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeAddSubERegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
  unsigned Rd, Rn, Rm;
  unsigned extend = fieldFromInstruction(insn, 10, 6);
  unsigned shift = extend & 0x7;

  if (shift > 4)
    return Fail;

  Rd = fieldFromInstruction(insn, 0, 5);
  Rn = fieldFromInstruction(insn, 5, 5);
  Rm = fieldFromInstruction(insn, 16, 5);

  switch (MCInst_getOpcode(Inst)) {
  default:
    return Fail;
  case AArch64_ADDWrx:
  case AArch64_SUBWrx:
    DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDSWrx:
  case AArch64_SUBSWrx:
    DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDXrx:
  case AArch64_SUBXrx:
    DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDSXrx:
  case AArch64_SUBSXrx:
    DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDXrx64:
  case AArch64_SUBXrx64:
    DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_SUBSXrx64:
  case AArch64_ADDSXrx64:
    DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  }

  MCOperand_CreateImm0(Inst, extend);
  return Success;
}